

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O1

int run_test_poll_oob(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  ssize_t sVar5;
  ulong uVar6;
  uint extraout_EDX;
  char *unaff_RBX;
  ulong *puVar7;
  uint uVar8;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  ulong uStack_98;
  char acStack_8c [8];
  uint uStack_84;
  char *pcStack_80;
  ulong local_38;
  ulong local_30;
  sockaddr local_28;
  
  iVar2 = (int)&local_38;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_28);
  local_30 = (ulong)iVar1;
  local_38 = 0;
  if (local_30 == 0) {
    unaff_RBX = (char *)uv_default_loop();
    iVar1 = uv_tcp_init(unaff_RBX,&server_handle);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b4fbe;
    iVar1 = uv_tcp_init(unaff_RBX,&client_handle);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b4fcb;
    iVar1 = uv_tcp_init(unaff_RBX,&peer_handle);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b4fd8;
    iVar1 = uv_idle_init(unaff_RBX,&idle);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b4fe5;
    iVar1 = uv_tcp_bind(&server_handle,&local_28,0);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b4ff2;
    iVar1 = uv_listen(&server_handle,1,connection_cb);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b4fff;
    iVar1 = uv_tcp_nodelay(&client_handle,1);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b500c;
    client_fd = socket(2,1,0);
    local_30 = (ulong)client_fd;
    local_38 = 0;
    if ((long)local_30 < 0) goto LAB_001b5019;
    piVar3 = __errno_location();
    do {
      *piVar3 = 0;
      iVar1 = connect(client_fd,&local_28,0x10);
      if (iVar1 != -1) break;
    } while (*piVar3 == 4);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b5026;
    iVar1 = uv_run(unaff_RBX,0);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b5033;
    local_30 = (ulong)ticks;
    local_38 = 10;
    if (local_30 != 10) goto LAB_001b5040;
    local_30 = 1;
    local_38 = (ulong)cli_pr_check;
    if (local_38 != 1) goto LAB_001b504d;
    local_30 = 2;
    local_38 = (ulong)(uint)cli_rd_check;
    if (local_38 != 2) goto LAB_001b505a;
    local_30 = 1;
    local_38 = (ulong)srv_rd_check;
    if (local_38 != 1) goto LAB_001b5067;
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    local_30 = 0;
    iVar1 = uv_loop_close(unaff_RBX);
    local_38 = (ulong)iVar1;
    if (local_30 == local_38) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_poll_oob_cold_1();
LAB_001b4fbe:
    run_test_poll_oob_cold_2();
LAB_001b4fcb:
    run_test_poll_oob_cold_3();
LAB_001b4fd8:
    run_test_poll_oob_cold_4();
LAB_001b4fe5:
    run_test_poll_oob_cold_5();
LAB_001b4ff2:
    run_test_poll_oob_cold_6();
LAB_001b4fff:
    run_test_poll_oob_cold_7();
LAB_001b500c:
    run_test_poll_oob_cold_8();
LAB_001b5019:
    run_test_poll_oob_cold_16();
LAB_001b5026:
    run_test_poll_oob_cold_9();
LAB_001b5033:
    run_test_poll_oob_cold_10();
LAB_001b5040:
    run_test_poll_oob_cold_11();
LAB_001b504d:
    run_test_poll_oob_cold_12();
LAB_001b505a:
    run_test_poll_oob_cold_13();
LAB_001b5067:
    run_test_poll_oob_cold_14();
  }
  run_test_poll_oob_cold_15();
  if (iVar2 == 0) {
    iVar1 = uv_accept();
    if (iVar1 != 0) goto LAB_001b52d7;
    iVar1 = uv_fileno(&peer_handle,&server_fd);
    if (iVar1 != 0) goto LAB_001b52e6;
    uVar4 = uv_default_loop();
    iVar1 = uv_poll_init(uVar4,poll_req,client_fd);
    if (iVar1 != 0) goto LAB_001b52f5;
    uVar4 = uv_default_loop();
    iVar1 = uv_poll_init(uVar4,0x371160,server_fd);
    if (iVar1 != 0) goto LAB_001b5304;
    iVar1 = uv_poll_start(poll_req,0xb,poll_cb);
    if (iVar1 != 0) goto LAB_001b5313;
    iVar1 = uv_poll_start(0x371160,1,poll_cb);
    if (iVar1 != 0) goto LAB_001b5322;
    unaff_RBX = "hello";
    do {
      sVar5 = send(server_fd,"hello",5,1);
      if (-1 < (int)sVar5) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if ((int)sVar5 != 5) goto LAB_001b5331;
    unaff_RBX = "world";
    do {
      sVar5 = send(server_fd,"world",5,0);
      if (-1 < (int)sVar5) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if ((int)sVar5 != 5) goto LAB_001b5340;
    iVar1 = uv_idle_start(&idle,idle_cb);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    connection_cb_cold_1();
LAB_001b52d7:
    connection_cb_cold_2();
LAB_001b52e6:
    connection_cb_cold_3();
LAB_001b52f5:
    connection_cb_cold_4();
LAB_001b5304:
    connection_cb_cold_5();
LAB_001b5313:
    connection_cb_cold_6();
LAB_001b5322:
    connection_cb_cold_7();
LAB_001b5331:
    connection_cb_cold_8();
LAB_001b5340:
    connection_cb_cold_9();
  }
  connection_cb_cold_10();
  pcStack_80 = unaff_RBX;
  iVar1 = uv_fileno();
  uStack_98 = (ulong)iVar1;
  if (uStack_98 != 0) goto LAB_001b575e;
  acStack_8c[0] = '\0';
  acStack_8c[1] = '\0';
  acStack_8c[2] = '\0';
  acStack_8c[3] = '\0';
  acStack_8c[4] = 0;
  if ((extraout_EDX & 8) != 0) {
    do {
      sVar5 = recv(client_fd,acStack_8c,5,1);
      if ((int)sVar5 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if ((-1 < (int)sVar5) || (piVar3 = __errno_location(), *piVar3 != 0x16)) {
      cli_pr_check = 1;
      iVar1 = uv_poll_stop(poll_req);
      uStack_98 = (ulong)iVar1;
      if (uStack_98 != 0) goto LAB_001b576d;
      iVar1 = uv_poll_start(poll_req,3,poll_cb);
      uStack_98 = (ulong)iVar1;
      if (uStack_98 == 0) goto LAB_001b5459;
      goto LAB_001b577c;
    }
    goto LAB_001b57b8;
  }
LAB_001b5459:
  uVar6 = uStack_98;
  if ((extraout_EDX & 1) == 0) {
LAB_001b56e4:
    if ((extraout_EDX & 2) == 0) {
      return (int)uVar6;
    }
    do {
      sVar5 = send(client_fd,"foo",3,0);
      if (-1 < (int)sVar5) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    uStack_98 = 3;
    if ((int)sVar5 == 3) {
      return 3;
    }
    goto LAB_001b578b;
  }
  if (uStack_84 != client_fd) {
LAB_001b562f:
    uVar6 = (ulong)uStack_84;
    if (uStack_84 != server_fd) goto LAB_001b56e4;
    do {
      puVar7 = (ulong *)(ulong)(uint)server_fd;
      sVar5 = recv(server_fd,acStack_8c,3,0);
      iVar1 = (int)sVar5;
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if ((iVar1 < 0) && (piVar3 = __errno_location(), *piVar3 == 0x16)) goto LAB_001b57fe;
    uStack_98 = 3;
    if (iVar1 != 3) goto LAB_001b579a;
    iVar1 = strncmp(acStack_8c,"foo",3);
    uStack_98 = (ulong)iVar1;
    if (uStack_98 == 0) {
      srv_rd_check = 1;
      uVar6 = uv_poll_stop(0x371160);
      goto LAB_001b56e4;
    }
    goto LAB_001b57a9;
  }
  do {
    sVar5 = recv(client_fd,acStack_8c,5,0);
    iVar1 = (int)sVar5;
    if (iVar1 != -1) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if ((iVar1 < 0) && (piVar3 = __errno_location(), *piVar3 == 0x16)) goto LAB_001b57db;
  if (cli_rd_check == 1) {
    iVar2 = strncmp(acStack_8c,"world",(long)iVar1);
    uStack_98 = (ulong)iVar2;
    if (uStack_98 != 0) goto LAB_001b57bd;
    uStack_98 = 5;
    if ((long)iVar1 == 5) {
      cli_rd_check = 2;
      goto LAB_001b551a;
    }
    goto LAB_001b57cc;
  }
LAB_001b551a:
  if (cli_rd_check != 0) goto LAB_001b562f;
  uStack_98 = 4;
  if (iVar1 != 4) goto LAB_001b57e0;
  iVar1 = strncmp(acStack_8c,"hello",4);
  uStack_98 = (ulong)iVar1;
  if (uStack_98 == 0) {
    cli_rd_check = 1;
LAB_001b5590:
    puVar7 = (ulong *)(ulong)(uint)server_fd;
    sVar5 = recv(server_fd,acStack_8c,5,0);
    uVar8 = (uint)sVar5;
    if (uVar8 == 0xffffffff) goto code_r0x001b55ae;
    goto LAB_001b55b8;
  }
  goto LAB_001b57ef;
code_r0x001b55ae:
  piVar3 = __errno_location();
  if (*piVar3 == 4) goto LAB_001b5590;
LAB_001b55b8:
  if ((int)uVar8 < 1) {
    piVar3 = __errno_location();
    if ((*piVar3 == 0xb) || (*piVar3 == 0x73)) goto LAB_001b562f;
    goto LAB_001b5803;
  }
  uStack_98 = 5;
  if ((uVar8 & 0x7fffffff) == 5) {
    iVar1 = strncmp(acStack_8c,"world",5);
    uStack_98 = (ulong)iVar1;
    if (uStack_98 != 0) goto LAB_001b574f;
    cli_rd_check = 2;
    goto LAB_001b5590;
  }
  poll_cb_cold_14();
LAB_001b574f:
  poll_cb_cold_15();
LAB_001b575e:
  poll_cb_cold_1();
LAB_001b576d:
  poll_cb_cold_3();
LAB_001b577c:
  poll_cb_cold_4();
LAB_001b578b:
  poll_cb_cold_16();
LAB_001b579a:
  poll_cb_cold_11();
LAB_001b57a9:
  poll_cb_cold_12();
LAB_001b57b8:
  poll_cb_cold_2();
LAB_001b57bd:
  poll_cb_cold_6();
LAB_001b57cc:
  poll_cb_cold_7();
LAB_001b57db:
  poll_cb_cold_5();
LAB_001b57e0:
  poll_cb_cold_8();
LAB_001b57ef:
  puVar7 = &uStack_98;
  poll_cb_cold_9();
LAB_001b57fe:
  poll_cb_cold_10();
LAB_001b5803:
  poll_cb_cold_13();
  uv_sleep(100);
  iVar1 = ticks;
  ticks = ticks + 1;
  if (iVar1 < 9) {
    return iVar1;
  }
  uv_poll_stop(poll_req);
  uv_poll_stop(0x371160);
  uv_close(&server_handle,0);
  uv_close(&client_handle,0);
  uv_close(&peer_handle,0);
  iVar1 = uv_close(puVar7,0);
  return iVar1;
}

Assistant:

TEST_IMPL(poll_oob) {
  struct sockaddr_in addr;
  int r = 0;
  uv_loop_t* loop;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT_OK(uv_tcp_init(loop, &server_handle));
  ASSERT_OK(uv_tcp_init(loop, &client_handle));
  ASSERT_OK(uv_tcp_init(loop, &peer_handle));
  ASSERT_OK(uv_idle_init(loop, &idle));
  ASSERT_OK(uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT_OK(uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT_OK(uv_tcp_nodelay(&client_handle, 1));

  client_fd = socket(PF_INET, SOCK_STREAM, 0);
  ASSERT_GE(client_fd, 0);
  do {
    errno = 0;
    r = connect(client_fd, (const struct sockaddr*)&addr, sizeof(addr));
  } while (r == -1 && errno == EINTR);
  ASSERT_OK(r);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_EQ(ticks, kMaxTicks);

  /* Did client receive the POLLPRI message */
  ASSERT_EQ(1, cli_pr_check);
  /* Did client receive the POLLIN message */
  ASSERT_EQ(2, cli_rd_check);
  /* Could we write with POLLOUT and did the server receive our POLLOUT message
   * through POLLIN.
   */
  ASSERT_EQ(1, srv_rd_check);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}